

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

char * ascii_read_one_field(ImportCtx *p)

{
  int iVar1;
  uint uVar2;
  long in_RDI;
  int rSep;
  int cSep;
  int c;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  int iVar3;
  int local_14;
  char *local_8;
  
  iVar1 = *(int *)(in_RDI + 0x3c);
  iVar3 = *(int *)(in_RDI + 0x40);
  *(undefined4 *)(in_RDI + 0x20) = 0;
  local_14 = fgetc(*(FILE **)(in_RDI + 8));
  if ((local_14 == -1) || (seenInterrupt != 0)) {
    *(undefined4 *)(in_RDI + 0x38) = 0xffffffff;
    local_8 = (char *)0x0;
  }
  else {
    while( true ) {
      uVar2 = in_stack_ffffffffffffffe0 & 0xffffff;
      if ((local_14 != -1) && (uVar2 = in_stack_ffffffffffffffe0 & 0xffffff, local_14 != iVar1)) {
        uVar2 = CONCAT13(local_14 != iVar3,(int3)in_stack_ffffffffffffffe0);
      }
      in_stack_ffffffffffffffe0 = uVar2;
      if ((char)(in_stack_ffffffffffffffe0 >> 0x18) == '\0') break;
      import_append_char((ImportCtx *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
      local_14 = fgetc(*(FILE **)(in_RDI + 8));
    }
    if (local_14 == iVar3) {
      *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
    }
    *(int *)(in_RDI + 0x38) = local_14;
    if (*(long *)(in_RDI + 0x18) != 0) {
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)*(int *)(in_RDI + 0x20)) = 0;
    }
    local_8 = *(char **)(in_RDI + 0x18);
  }
  return local_8;
}

Assistant:

static char *SQLITE_CDECL ascii_read_one_field(ImportCtx *p) {
	int c;
	int cSep = p->cColSep;
	int rSep = p->cRowSep;
	p->n = 0;
	c = fgetc(p->in);
	if (c == EOF || seenInterrupt) {
		p->cTerm = EOF;
		return 0;
	}
	while (c != EOF && c != cSep && c != rSep) {
		import_append_char(p, c);
		c = fgetc(p->in);
	}
	if (c == rSep) {
		p->nLine++;
	}
	p->cTerm = c;
	if (p->z)
		p->z[p->n] = 0;
	return p->z;
}